

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack4_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar12 [32];
  
  auVar2 = vpmovsxbd_avx(ZEXT416(0x100c0804));
  uVar1 = *in;
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar15._8_8_ = 0x1800000014;
  auVar15._0_8_ = 0x1800000014;
  auVar6 = vpmovsxbd_avx512f(_DAT_00184410);
  auVar7 = vpbroadcastd_avx512f();
  auVar11 = vpsrlvd_avx2(auVar10,auVar2);
  auVar3 = vpsrlvd_avx2(auVar7._0_16_,auVar2);
  auVar4 = vpsrlvd_avx2(auVar7._0_16_,auVar15);
  auVar15 = vpshufd_avx(auVar15,0x50);
  auVar5 = valignd_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar11),7);
  auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar10),1);
  auVar11 = vpsrlvd_avx2(auVar10,auVar15);
  auVar13._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar2;
  auVar13._16_16_ = ZEXT116(1) * auVar11;
  auVar5 = vpblendd_avx2(auVar5,auVar13,0x60);
  auVar7 = vpbroadcastd_avx512f();
  auVar6 = vpermi2d_avx512f(auVar6,ZEXT3664(CONCAT432(auVar7._32_4_,auVar5)),ZEXT1664(auVar3));
  auVar7 = vpmovsxbd_avx512f(_DAT_0019ce20);
  auVar6 = vpermi2d_avx512f(auVar7,auVar6,ZEXT1664(auVar4));
  auVar7 = vpbroadcastd_avx512f(ZEXT416(0xf));
  auVar8 = valignd_avx512f(auVar6,auVar6,9);
  auVar6 = vpandd_avx512f(auVar6,auVar7);
  auVar8 = vpsrld_avx512f(auVar8,0x1c);
  auVar9._0_28_ = auVar6._0_28_;
  auVar9._28_4_ = auVar8._28_4_;
  auVar9._32_4_ = auVar6._32_4_;
  auVar9._36_4_ = auVar6._36_4_;
  auVar9._40_4_ = auVar6._40_4_;
  auVar9._44_4_ = auVar6._44_4_;
  auVar9._48_4_ = auVar6._48_4_;
  auVar9._52_4_ = auVar6._52_4_;
  auVar9._60_4_ = auVar8._60_4_;
  auVar9._56_4_ = auVar6._56_4_;
  auVar6 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])out = auVar6;
  uVar1 = in[2];
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar12._16_4_ = uVar1;
  auVar12._0_16_ = auVar11;
  auVar12._20_4_ = uVar1;
  auVar12._24_4_ = uVar1;
  auVar12._28_4_ = uVar1;
  auVar2 = vpsrlvd_avx2(auVar11,auVar2);
  auVar15 = vpsrlvd_avx2(auVar11,auVar15);
  auVar5 = valignd_avx512vl(ZEXT1632(auVar2),ZEXT1632(auVar2),7);
  auVar5 = vpblendd_avx2(auVar5,auVar12,1);
  auVar13 = vpsrld_avx2(auVar12,0x1c);
  auVar14._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar5._0_16_;
  auVar14._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar15;
  auVar5 = vpblendd_avx2(auVar5,auVar14,0x60);
  auVar5 = vpand_avx2(auVar5,auVar7._0_32_);
  auVar5 = vpblendd_avx2(auVar5,auVar13,0x80);
  *(undefined1 (*) [32])(out + 0x10) = auVar5;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack4_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;

  return in;
}